

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O1

void __thiscall gnilk::IPCResultSummary::Unmarshal(IPCResultSummary *this)

{
  IPCDecoderBase *in_RSI;
  
  Unmarshal((IPCResultSummary *)
            &this[-1].testResults.
             super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

bool IPCResultSummary::Unmarshal(IPCDecoderBase &decoder) {
    decoder.ReadI32(testsExecuted);
    decoder.ReadI32(testsFailed);
    decoder.ReadDouble(durationSec);
    decoder.ReadArray([this](IPCObject *ptrObject) {
       auto tr = dynamic_cast<IPCTestResults *>(ptrObject);
       testResults.push_back(tr);
    });

    return true;
}